

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_error_toobig(sqlite3_context *pCtx)

{
  pCtx->isError = 0x12;
  sqlite3VdbeMemSetStr(pCtx->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_toobig(sqlite3_context *pCtx){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  pCtx->isError = SQLITE_TOOBIG;
  sqlite3VdbeMemSetStr(pCtx->pOut, "string or blob too big", -1,
                       SQLITE_UTF8, SQLITE_STATIC);
}